

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManDivAddLits(Vec_Int_t *vCube,Vec_Int_t *vCube2,Vec_Int_t *vDiv)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int t_1;
  int t;
  int *pArray;
  int Lit;
  int i;
  Vec_Int_t *vDiv_local;
  Vec_Int_t *vCube2_local;
  Vec_Int_t *vCube_local;
  
  for (pArray._4_4_ = 0; iVar1 = Vec_IntSize(vDiv), pArray._4_4_ < iVar1;
      pArray._4_4_ = pArray._4_4_ + 1) {
    iVar1 = Vec_IntEntry(vDiv,pArray._4_4_);
    iVar2 = Abc_LitIsCompl(iVar1);
    if (iVar2 == 0) {
      iVar1 = Abc_Lit2Var(iVar1);
      Vec_IntPush(vCube,iVar1);
    }
    else {
      iVar1 = Abc_Lit2Var(iVar1);
      Vec_IntPush(vCube2,iVar1);
    }
  }
  iVar1 = Vec_IntSize(vDiv);
  if ((iVar1 == 4) && (iVar1 = Vec_IntSize(vCube), iVar1 == 3)) {
    iVar1 = Vec_IntSize(vCube2);
    if (iVar1 != 3) {
      __assert_fail("Vec_IntSize(vCube2) == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                    ,0x2d5,"void Fx_ManDivAddLits(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    piVar3 = Vec_IntArray(vCube);
    if (piVar3[2] < piVar3[1]) {
      iVar1 = piVar3[1];
      piVar3[1] = piVar3[2];
      piVar3[2] = iVar1;
    }
    piVar3 = Vec_IntArray(vCube2);
    if (piVar3[2] < piVar3[1]) {
      iVar1 = piVar3[1];
      piVar3[1] = piVar3[2];
      piVar3[2] = iVar1;
    }
  }
  return;
}

Assistant:

static inline void Fx_ManDivAddLits( Vec_Int_t * vCube, Vec_Int_t * vCube2, Vec_Int_t * vDiv )
{
    int i, Lit, * pArray;
//    Vec_IntClear( vCube );
//    Vec_IntClear( vCube2 );
    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl(Lit) )
            Vec_IntPush( vCube2, Abc_Lit2Var(Lit) );
        else
            Vec_IntPush( vCube, Abc_Lit2Var(Lit) );
    if ( Vec_IntSize(vDiv) == 4 && Vec_IntSize(vCube) == 3 )
    {
        assert( Vec_IntSize(vCube2) == 3 );
        pArray = Vec_IntArray(vCube);
        if ( pArray[1] > pArray[2] )
            ABC_SWAP( int, pArray[1], pArray[2] );
        pArray = Vec_IntArray(vCube2);
        if ( pArray[1] > pArray[2] )
            ABC_SWAP( int, pArray[1], pArray[2] );
    }
}